

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_help.c
# Opt level: O0

void test_help(void)

{
  wchar_t wVar1;
  char *file;
  size_t plen;
  char *p;
  int r;
  char *in_stack_00000488;
  wchar_t in_stack_00000494;
  char *in_stack_00000498;
  char *in_stack_000007f0;
  char *in_stack_000007f8;
  wchar_t in_stack_00000804;
  char *in_stack_00000808;
  void *extra;
  char *in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  undefined8 in_stack_fffffffffffffff0;
  wchar_t wVar2;
  undefined4 in_stack_fffffffffffffff8;
  
  wVar2 = (wchar_t)((ulong)in_stack_fffffffffffffff0 >> 0x20);
  wVar1 = systemf("%s --help >help.stdout 2>help.stderr",testprog);
  extra = (void *)0x0;
  assertion_equal_int((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),wVar2,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe0,0,(char *)0x109cd1,(void *)plen);
  failure("--help should generate nothing to stderr.");
  assertion_empty_file(in_stack_00000498,in_stack_00000494,in_stack_00000488);
  file = slurpfile((size_t *)&stack0xffffffffffffffe8,"help.stdout");
  failure("Help output should be long enough.");
  assertion_assert(file,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   in_stack_ffffffffffffffe0,extra);
  failure("First line of help output should contain \'bsdcat\': %s",file);
  in_first_line((char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                in_stack_ffffffffffffffe0);
  assertion_assert(file,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   in_stack_ffffffffffffffe0,extra);
  free(file);
  wVar2 = (wchar_t)((ulong)file >> 0x20);
  wVar1 = systemf("%s -h >h.stdout 2>h.stderr",testprog);
  assertion_equal_int((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),wVar2,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe0,0,(char *)0x109de2,(void *)plen);
  failure("-h should generate nothing to stderr.");
  assertion_empty_file(in_stack_00000498,in_stack_00000494,in_stack_00000488);
  failure("stdout should be same for -h and --help");
  assertion_equal_file(in_stack_00000808,in_stack_00000804,in_stack_000007f8,in_stack_000007f0);
  return;
}

Assistant:

DEFINE_TEST(test_help)
{
	int r;
	char *p;
	size_t plen;

	/* Exercise --help option. */
	r = systemf("%s --help >help.stdout 2>help.stderr", testprog);
	assertEqualInt(r, 0);
	failure("--help should generate nothing to stderr.");
	assertEmptyFile("help.stderr");
	/* Help message should start with name of program. */
	p = slurpfile(&plen, "help.stdout");
	failure("Help output should be long enough.");
	assert(plen >= 6);
	failure("First line of help output should contain 'bsdcat': %s", p);
	assert(in_first_line(p, "bsdcat"));
	/*
	 * TODO: Extend this check to further verify that --help output
	 * looks approximately right.
	 */
	free(p);

	/* -h option should generate the same output. */
	r = systemf("%s -h >h.stdout 2>h.stderr", testprog);
	assertEqualInt(r, 0);
	failure("-h should generate nothing to stderr.");
	assertEmptyFile("h.stderr");
	failure("stdout should be same for -h and --help");
	assertEqualFile("h.stdout", "help.stdout");
}